

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3StrICmp(char *zLeft,char *zRight)

{
  long lVar1;
  uchar *b;
  uchar *a;
  
  lVar1 = 0;
  while( true ) {
    if (((ulong)(byte)zLeft[lVar1] == 0) || (""[(byte)zLeft[lVar1]] != ""[(byte)zRight[lVar1]]))
    break;
    lVar1 = lVar1 + 1;
  }
  return (uint)""[(byte)zLeft[lVar1]] - (uint)""[(byte)zRight[lVar1]];
}

Assistant:

SQLITE_PRIVATE int sqlite3StrICmp(const char *zLeft, const char *zRight){
  unsigned char *a, *b;
  int c;
  a = (unsigned char *)zLeft;
  b = (unsigned char *)zRight;
  for(;;){
    c = (int)UpperToLower[*a] - (int)UpperToLower[*b];
    if( c || *a==0 ) break;
    a++;
    b++;
  }
  return c;
}